

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O2

void __thiscall
duckdb::DropNotNullInfo::DropNotNullInfo
          (DropNotNullInfo *this,AlterEntryData *data,string *column_name_p)

{
  AlterEntryData local_80;
  
  AlterEntryData::AlterEntryData(&local_80,data);
  AlterTableInfo::AlterTableInfo(&this->super_AlterTableInfo,DROP_NOT_NULL,&local_80);
  AlterEntryData::~AlterEntryData(&local_80);
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__DropNotNullInfo_027a7de0;
  ::std::__cxx11::string::string((string *)&this->column_name,(string *)column_name_p);
  return;
}

Assistant:

DropNotNullInfo::DropNotNullInfo(AlterEntryData data, string column_name_p)
    : AlterTableInfo(AlterTableType::DROP_NOT_NULL, std::move(data)), column_name(std::move(column_name_p)) {
}